

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execBcc<(moira::Instr)27,(moira::Mode)12,(moira::Size)2>(Moira *this,u16 opcode)

{
  u32 uVar1;
  uint addr;
  AEStackFrame frame;
  
  (*this->_vptr_Moira[0x19])(this,2);
  if ((this->reg).sr.v != false) {
    (*this->_vptr_Moira[0x19])(this,2);
    readExt(this);
    uVar1 = (this->reg).pc;
    (this->reg).pc0 = uVar1;
    (this->queue).ird = (this->queue).irc;
    uVar1 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar1 + 2);
    (this->queue).irc = (u16)uVar1;
    return;
  }
  uVar1 = (this->reg).pc;
  addr = (int)(short)(this->queue).irc + uVar1;
  if ((addr & 1) == 0) {
    (this->reg).pc = addr;
    fullPrefetch<4ul,0>(this);
    return;
  }
  frame = makeFrame<0ul>(this,addr,uVar1);
  execAddressError(this,frame,0);
  return;
}

Assistant:

void
Moira::execBcc(u16 opcode)
{
    sync(2);
    if (cond<I>()) {

        u32 newpc = reg.pc + (S == Word ? (i16)queue.irc : (i8)opcode);
        
        // Check for address error
        if (misaligned<Word>(newpc)) {
            execAddressError(makeFrame(newpc, reg.pc));
            return;
        }
                
        // Take branch
        reg.pc = newpc;
        fullPrefetch<POLLIPL>();

    } else {

        // Fall through to next instruction
        sync(2);
        if (S == Word) readExt();
        prefetch<POLLIPL>();
    }
}